

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

int NextTableBitSize(int *count,int len,int root_bits)

{
  long lVar1;
  int left;
  int root_bits_local;
  int len_local;
  int *count_local;
  
  len_local = len;
  for (left = 1 << ((char)len - (char)root_bits & 0x1fU);
      (len_local < 0xf && (lVar1 = (long)len_local, 0 < left - count[lVar1]));
      left = (left - count[lVar1]) * 2) {
    len_local = len_local + 1;
  }
  return len_local - root_bits;
}

Assistant:

static WEBP_INLINE int NextTableBitSize(const int* const count,
                                        int len, int root_bits) {
  int left = 1 << (len - root_bits);
  while (len < MAX_ALLOWED_CODE_LENGTH) {
    left -= count[len];
    if (left <= 0) break;
    ++len;
    left <<= 1;
  }
  return len - root_bits;
}